

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O2

bool Host_SendAllHere(void *userdata)

{
  uint uVar1;
  sockaddr_in *address;
  int iVar2;
  long lVar3;
  in_addr *piVar4;
  long lVar5;
  long lVar6;
  PreGamePacket packet;
  
  packet.Fake = '0';
  packet.Message = '\x03';
  lVar5 = 0;
  for (lVar6 = 1; lVar6 < doomcom.numnodes; lVar6 = lVar6 + 1) {
    packet.field_3.ConsoleNum = (BYTE)lVar6;
    if (*(int *)((long)userdata + lVar6 * 4) == 0) {
      piVar4 = &sendaddress[1].sin_addr;
      iVar2 = 0;
      for (lVar3 = 0; (ulong)(uint)(int)doomcom.numnodes - 1 != lVar3; lVar3 = lVar3 + 1) {
        if (lVar5 != lVar3) {
          packet.machines[iVar2].address = piVar4->s_addr;
          packet.machines[iVar2].port = ((sockaddr_in *)(piVar4 + -1))->sin_port;
          packet.machines[iVar2].player = (BYTE)packet.field_3;
          iVar2 = iVar2 + 1;
        }
        piVar4 = piVar4 + 4;
      }
      packet.NumNodes = (char)doomcom.numnodes + 0xfe;
      iVar2 = iVar2 * 8 + 4;
    }
    else {
      packet.NumNodes = '\0';
      iVar2 = 4;
    }
    PreSend(&packet,iVar2,sendaddress + lVar6);
    lVar5 = lVar5 + 1;
  }
  while( true ) {
    address = PreGet(&packet,0x44,false);
    if (address == (sockaddr_in *)0x0) break;
    if ((packet.Fake == '0') && (packet.Message == '\x06')) {
      uVar1 = FindNode(address);
      if ((-1 < (int)uVar1) && (*(int *)((long)userdata + (ulong)uVar1 * 4) == 0)) {
        *(undefined4 *)((long)userdata + (ulong)uVar1 * 4) = 1;
        *(int *)((long)userdata + 0x20) = *(int *)((long)userdata + 0x20) + 1;
      }
      PreSend(&packet,2,address);
    }
  }
  return *(int *)((long)userdata + 0x20) == doomcom.numnodes + -1;
}

Assistant:

bool Host_SendAllHere (void *userdata)
{
	int *gotack = (int *)userdata;	// ackcount is at gotack[MAXNETNODES]
	PreGamePacket packet;
	int node;
	sockaddr_in *from;

	// Send out address information to all guests. Guests that have already
	// acknowledged receipt effectively get just a heartbeat packet.
	packet.Fake = PRE_FAKE;
	packet.Message = PRE_ALLHERE;
	for (node = 1; node < doomcom.numnodes; node++)
	{
		int machine, spot = 0;

		packet.ConsoleNum = node;
		if (!gotack[node])
		{
			for (spot = 0, machine = 1; machine < doomcom.numnodes; machine++)
			{
				if (node != machine)
				{
					packet.machines[spot].address = sendaddress[machine].sin_addr.s_addr;
					packet.machines[spot].port = sendaddress[machine].sin_port;
					packet.machines[spot].player = node;

					spot++;	// fixes problem of new address replacing existing address in
							// array; it's supposed to increment the index before getting
							// and storing in the packet the next address.
				}
			}
			packet.NumNodes = doomcom.numnodes - 2;
		}
		else
		{
			packet.NumNodes = 0;
		}
		PreSend (&packet, 4 + spot*8, &sendaddress[node]);
	}

	// Check for replies.
	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake == PRE_FAKE && packet.Message == PRE_ALLHEREACK)
		{
			node = FindNode (from);
			if (node >= 0)
			{
				if (!gotack[node])
				{
					gotack[node] = true;
					gotack[MAXNETNODES]++;
				}
			}
			PreSend (&packet, 2, from);
		}
	}

	// If everybody has replied, then this loop can end.
	return gotack[MAXNETNODES] == doomcom.numnodes - 1;
}